

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::ConvertToHalfPass::EquivFloatTypeId
          (ConvertToHalfPass *this,uint32_t ty_id,uint32_t width)

{
  uint32_t uVar1;
  uint32_t vty_id;
  DefUseManager *this_00;
  Instruction *this_01;
  Type *type;
  TypeManager *this_02;
  
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  this_01 = analysis::DefUseManager::GetDef(this_00,ty_id);
  if (this_01->opcode_ == OpTypeVector) {
    uVar1 = Instruction::GetSingleWordInOperand(this_01,1);
    type = FloatVectorType(this,uVar1,width);
  }
  else if (this_01->opcode_ == OpTypeMatrix) {
    uVar1 = Instruction::GetSingleWordInOperand(this_01,1);
    vty_id = Instruction::GetSingleWordInOperand(this_01,0);
    type = FloatMatrixType(this,uVar1,vty_id,width);
  }
  else {
    type = FloatScalarType(this,width);
  }
  this_02 = IRContext::get_type_mgr((this->super_Pass).context_);
  uVar1 = analysis::TypeManager::GetTypeInstruction(this_02,type);
  return uVar1;
}

Assistant:

uint32_t ConvertToHalfPass::EquivFloatTypeId(uint32_t ty_id, uint32_t width) {
  analysis::Type* reg_equiv_ty;
  Instruction* ty_inst = get_def_use_mgr()->GetDef(ty_id);
  if (ty_inst->opcode() == spv::Op::OpTypeMatrix)
    reg_equiv_ty = FloatMatrixType(ty_inst->GetSingleWordInOperand(1),
                                   ty_inst->GetSingleWordInOperand(0), width);
  else if (ty_inst->opcode() == spv::Op::OpTypeVector)
    reg_equiv_ty = FloatVectorType(ty_inst->GetSingleWordInOperand(1), width);
  else  // spv::Op::OpTypeFloat
    reg_equiv_ty = FloatScalarType(width);
  return context()->get_type_mgr()->GetTypeInstruction(reg_equiv_ty);
}